

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O0

void opj_sparse_array_int32_free(opj_sparse_array_int32_t *sa)

{
  uint local_14;
  OPJ_UINT32 i;
  opj_sparse_array_int32_t *sa_local;
  
  if (sa != (opj_sparse_array_int32_t *)0x0) {
    for (local_14 = 0; local_14 < sa->block_count_hor * sa->block_count_ver; local_14 = local_14 + 1
        ) {
      if (sa->data_blocks[local_14] != (OPJ_INT32 *)0x0) {
        opj_free(sa->data_blocks[local_14]);
      }
    }
    opj_free(sa->data_blocks);
    opj_free(sa);
  }
  return;
}

Assistant:

void opj_sparse_array_int32_free(opj_sparse_array_int32_t* sa)
{
    if (sa) {
        OPJ_UINT32 i;
        for (i = 0; i < sa->block_count_hor * sa->block_count_ver; i++) {
            if (sa->data_blocks[i]) {
                opj_free(sa->data_blocks[i]);
            }
        }
        opj_free(sa->data_blocks);
        opj_free(sa);
    }
}